

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O3

void __thiscall QHttpNetworkRequest::setHTTP2Allowed(QHttpNetworkRequest *this,bool b)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1) {
    QSharedDataPointer<QHttpNetworkRequestPrivate>::detach_helper(&this->d);
    pQVar1 = (this->d).d.ptr;
  }
  pQVar1->http2Allowed = b;
  return;
}

Assistant:

void QHttpNetworkRequest::setHTTP2Allowed(bool b)
{
    d->http2Allowed = b;
}